

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int finishing,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  archive *a;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ZSTD_inBuffer in;
  ZSTD_inBuffer local_48;
  
  local_48.pos = 0;
  output = &data->out;
  local_48.src = src;
  local_48.size = length;
  while( true ) {
    sVar3 = (data->out).pos;
    if (sVar3 == (data->out).size) {
      iVar1 = __archive_write_filter(f->next_filter,output->dst,sVar3);
      if (iVar1 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
    if (finishing == 0) {
      if (local_48.pos == local_48.size) {
        return 0;
      }
      sVar3 = ZSTD_compressStream(data->cstream,output,&local_48);
    }
    else {
      sVar3 = ZSTD_endStream(data->cstream,output);
    }
    uVar2 = ZSTD_isError(sVar3);
    if (uVar2 != 0) break;
    if ((finishing != 0) && (sVar3 == 0)) {
      iVar1 = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
      return iVar1;
    }
  }
  a = f->archive;
  pcVar4 = ZSTD_getErrorName(sVar3);
  archive_set_error(a,-1,"Zstd compression failed: %s",pcVar4);
  return -0x1e;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing, const void *src, size_t length)
{
	ZSTD_inBuffer in = (ZSTD_inBuffer) { src, length, 0 };

	for (;;) {
		if (data->out.pos == data->out.size) {
			const int ret = __archive_write_filter(f->next_filter,
			    data->out.dst, data->out.size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->out.pos = 0;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && in.pos == in.size)
			return (ARCHIVE_OK);

		{
			const size_t zstdret = !finishing ?
			    ZSTD_compressStream(data->cstream, &data->out, &in)
			    : ZSTD_endStream(data->cstream, &data->out);

			if (ZSTD_isError(zstdret)) {
				archive_set_error(f->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Zstd compression failed: %s",
				    ZSTD_getErrorName(zstdret));
				return (ARCHIVE_FATAL);
			}

			/* If we're finishing, 0 means nothing left to flush */
			if (finishing && zstdret == 0) {
				const int ret = __archive_write_filter(f->next_filter,
				    data->out.dst, data->out.pos);
				return (ret);
			}
		}
	}
}